

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O0

anon_unknown_dwarf_39db * __thiscall
anon_unknown.dwarf_39db::xmlEscape(anon_unknown_dwarf_39db *this,string *source)

{
  char *pcVar1;
  undefined8 local_28;
  size_t pos;
  string *source_local;
  string *result;
  
  std::__cxx11::string::string((string *)this,(string *)source);
  local_28 = std::__cxx11::string::find_first_of((char *)this,0x11c050);
  while (local_28 != 0xffffffffffffffff) {
    pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)this);
    if (*pcVar1 == '<') {
      std::__cxx11::string::replace((ulong)this,local_28,(char *)0x1);
    }
    else {
      pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)this);
      if (*pcVar1 == '>') {
        std::__cxx11::string::replace((ulong)this,local_28,(char *)0x1);
      }
    }
    local_28 = std::__cxx11::string::find_first_of((char *)this,0x11c050);
  }
  return this;
}

Assistant:

std::string xmlEscape(std::string const& source)
    {
        string result = source;
        size_t pos = result.find_first_of("<>");
        while (pos != string::npos)
        {
            if (result[pos] == '<')
                result.replace(pos, 1, "&lt;");
            else if (result[pos] == '>')
                result.replace(pos, 1, "&gt;");
            pos = result.find_first_of("<>");
        }

        return result;
    }